

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_to_hir.cpp
# Opt level: O0

ir_rvalue * __thiscall
ast_compound_statement::hir
          (ast_compound_statement *this,exec_list *instructions,_mesa_glsl_parse_state *state)

{
  bool bVar1;
  long *local_40;
  long *local_38;
  long *local_28;
  ast_node *ast;
  _mesa_glsl_parse_state *state_local;
  exec_list *instructions_local;
  ast_compound_statement *this_local;
  
  if (this->new_scope != 0) {
    glsl_symbol_table::push_scope(state->symbols);
  }
  bVar1 = ::exec_node_is_tail_sentinel((this->statements).head_sentinel.next);
  if (bVar1) {
    local_38 = (long *)0x0;
  }
  else {
    local_38 = (long *)((long)(this->statements).head_sentinel.next -
                       ((long)(this->statements).head_sentinel.next +
                       (0x28 - (long)(this->statements).head_sentinel.next)));
  }
  local_28 = local_38;
  while (local_28 != (long *)0x0) {
    (**(code **)(*local_28 + 8))(local_28,instructions,state);
    bVar1 = ::exec_node_is_tail_sentinel((exec_node *)local_28[5]);
    if (bVar1) {
      local_40 = (long *)0x0;
    }
    else {
      local_40 = (long *)(local_28[5] - ((local_28[5] + 0x28) - local_28[5]));
    }
    local_28 = local_40;
  }
  if (this->new_scope != 0) {
    glsl_symbol_table::pop_scope(state->symbols);
  }
  return (ir_rvalue *)0x0;
}

Assistant:

ir_rvalue *
ast_compound_statement::hir(exec_list *instructions,
                            struct _mesa_glsl_parse_state *state)
{
   if (new_scope)
      state->symbols->push_scope();

   foreach_list_typed (ast_node, ast, link, &this->statements)
      ast->hir(instructions, state);

   if (new_scope)
      state->symbols->pop_scope();

   /* Compound statements do not have r-values.
    */
   return NULL;
}